

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O3

int OpenSSLWrapper::SslServerContext::SNI_CB(SSL *ssl,char param_2,void *arg)

{
  char cVar1;
  SslContext *pSVar2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  bool bVar5;
  int iVar6;
  char *__s;
  code *pcVar7;
  void *pvVar8;
  undefined8 *puVar9;
  size_t sVar10;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var11;
  SSL_CTX *ctx;
  size_t sVar12;
  size_t sVar13;
  SslContext *this;
  string strHostName;
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fnDomainCompare;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  size_t local_d0;
  long local_c8 [2];
  undefined1 local_b8 [24];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  SSL *local_78;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_70;
  _Any_data local_50;
  code *local_40;
  
  __s = SSL_get_servername((SSL *)ssl,0);
  if (__s == (char *)0x0) {
    pcVar7 = (code *)SSL_get_ex_data((SSL *)ssl,0);
    pvVar8 = SSL_get_ex_data((SSL *)ssl,1);
    if (pvVar8 == (void *)0x0 || pcVar7 == (code *)0x0) {
      return 3;
    }
    puVar9 = (undefined8 *)(*pcVar7)(pvVar8);
    __s = (char *)*puVar9;
  }
  if (__s == (char *)0x0 || arg == (void *)0x0) {
    return 3;
  }
  local_d8._M_current = (char *)local_c8;
  local_78 = (SSL *)ssl;
  sVar10 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,__s,__s + sVar10);
  sVar10 = local_d0;
  _Var4._M_current = local_d8._M_current;
  if (local_d0 == 0) {
    sVar12 = 0;
  }
  else {
    sVar13 = 0;
    do {
      iVar6 = tolower((int)*(_Var4._M_current + sVar13));
      *(char *)((long)_Var4._M_current + sVar13) = (char)iVar6;
      sVar13 = sVar13 + 1;
      sVar12 = local_d0;
    } while (sVar10 != sVar13);
  }
  local_b8._0_8_ = (pointer)(local_b8 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b8,local_d8._M_current,(long)local_d8._M_current + sVar12);
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_98._M_unused._M_object = operator_new(0x20);
  *(code **)local_98._M_unused._0_8_ = (code *)((long)local_98._M_unused._0_8_ + 0x10);
  if ((pointer)local_b8._0_8_ == (pointer)(local_b8 + 0x10)) {
    *(undefined8 *)((long)local_98._M_unused._0_8_ + 0x10) = local_b8._16_8_;
    *(char **)((long)local_98._M_unused._0_8_ + 0x18) = _Stack_a0._M_current;
  }
  else {
    *(undefined8 *)local_98._M_unused._0_8_ = local_b8._0_8_;
    *(undefined8 *)((long)local_98._M_unused._0_8_ + 0x10) = local_b8._16_8_;
  }
  *(undefined8 *)((long)local_98._M_unused._0_8_ + 8) = local_b8._8_8_;
  pcStack_80 = std::
               _Function_handler<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/SocketLib/OpenSSLWraper.cpp:448:55)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/SocketLib/OpenSSLWraper.cpp:448:55)>
             ::_M_manager;
  this = *arg;
  pSVar2 = *(SslContext **)((long)arg + 8);
  if (this != pSVar2) {
    do {
      cVar1 = *(this->m_strCertComName)._M_dataplus._M_p;
      if (cVar1 == '^') {
        std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
        basic_regex<std::char_traits<char>,std::allocator<char>>
                  ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_70,
                   &this->m_strCertComName,0x10);
        local_b8._16_8_ = (pointer)0x0;
        _Stack_a0._M_current = (char *)0x0;
        local_b8._0_8_ = (pointer)0x0;
        local_b8._8_8_ = (pointer)0x0;
        bVar5 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                          (local_d8,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )(local_d8._M_current + local_d0),
                           (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)local_b8,&local_70,0);
        if ((pointer)local_b8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_b8._0_8_,local_b8._16_8_ - local_b8._0_8_);
        }
        if (!bVar5) goto LAB_00121b65;
LAB_00121c47:
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_70);
LAB_00121c51:
        ctx = (SSL_CTX *)SslContext::operator()(this);
        SSL_set_SSL_CTX(local_78,ctx);
        if (local_88 != (code *)0x0) {
          (*local_88)(&local_98,&local_98,__destroy_functor);
        }
        if ((long *)local_d8._M_current != local_c8) {
          operator_delete(local_d8._M_current,local_c8[0] + 1);
        }
        return 0;
      }
LAB_00121b65:
      sVar10 = (this->m_strCertComName)._M_string_length;
      if ((sVar10 == local_d0) &&
         ((sVar10 == 0 ||
          (iVar6 = bcmp((this->m_strCertComName)._M_dataplus._M_p,local_d8._M_current,sVar10),
          iVar6 == 0)))) {
        if (cVar1 != '^') goto LAB_00121c51;
        goto LAB_00121c47;
      }
      _Var11._M_current =
           (this->m_vstrAltNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      __last._M_current =
           (this->m_vstrAltNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      std::
      function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::function((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_50,
                 (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_98);
      _Var11 = std::
               find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::function<bool(std::__cxx11::string&)>>
                         (_Var11,__last,
                          (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                           *)&local_50);
      pbVar3 = (this->m_vstrAltNames).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
      if (cVar1 == '^') {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_70);
      }
      if (_Var11._M_current != pbVar3) goto LAB_00121c51;
      this = (SslContext *)&this[1].m_strCertComName._M_string_length;
    } while (this != pSVar2);
    if (local_88 == (code *)0x0) goto LAB_00121c29;
  }
  (*local_88)(&local_98,&local_98,__destroy_functor);
LAB_00121c29:
  if ((long *)local_d8._M_current != local_c8) {
    operator_delete(local_d8._M_current,local_c8[0] + 1);
  }
  return 3;
}

Assistant:

int SslServerContext::SNI_CB(SSL* ssl, char /*iCmd*/, void* arg)
    {
        vector<SslServerContext>* pSslCtx = static_cast<vector<SslServerContext>*>(arg);

        const char* szHostName = SSL_get_servername(ssl, TLSEXT_NAMETYPE_host_name);

        if (szHostName == nullptr)  // if the host name is not set, the connection was made by IP address, we use the IP of the interface the connection came in, to find the certificate
        {
            const string& (*fnForwarder)(void*) = reinterpret_cast<const string&(*)(void*)>(SSL_get_ex_data(ssl, 0));   // Index 0 = Funktion pointer to a static proxy function
            void* Obj = SSL_get_ex_data(ssl, 1);    // Index 1 is the "this" pointer of the SslTcpSocket how owns the ssl object
            if (fnForwarder != nullptr && Obj != nullptr)
                szHostName = fnForwarder(Obj).c_str(); // We get the IP address of the Interface the connection come in
        }

        if (pSslCtx != nullptr && szHostName != nullptr)
        {
            string strHostName(szHostName);
            transform(begin(strHostName), end(strHostName), begin(strHostName), [](char c) noexcept { return static_cast<char>(::tolower(c)); });

            function<bool(string&)> fnDomainCompare = [strHostName](string& it) -> bool
            {
                if (it[0] == '^')   // we have a regular expression
                    return regex_match(strHostName, regex(it));
                else
                    return it.compare(strHostName) == 0 ? true : false;
            };

            for (auto& it : *pSslCtx)
            {
                if ((it.m_strCertComName[0] == '^' && regex_match(strHostName, regex(it.m_strCertComName))) || it.m_strCertComName == strHostName || find_if(begin(it.m_vstrAltNames), end(it.m_vstrAltNames), fnDomainCompare) != end(it.m_vstrAltNames))
                {
                    SSL_set_SSL_CTX(ssl, it());
                    return SSL_TLSEXT_ERR_OK;
                }
            }
        }

        return SSL_TLSEXT_ERR_NOACK;
    }